

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Builder * __thiscall
capnp::DynamicList::Builder::operator[](Builder *__return_storage_ptr__,Builder *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  SegmentBuilder *pSVar4;
  CapTableBuilder *pCVar5;
  StructPointerCount SVar6;
  undefined1 uVar7;
  ListElementCount LVar8;
  BitsPerElementN<23> BVar9;
  ElementSize EVar10;
  Which WVar11;
  uint uVar12;
  StructSchema SVar13;
  ulong uVar14;
  EnumSchema EVar15;
  InterfaceSchema IVar16;
  uint uVar17;
  ListBuilder *__return_storage_ptr___00;
  Type TVar18;
  ArrayPtr<unsigned_char> AVar19;
  uint index_local;
  Fault f;
  undefined4 uStack_108;
  undefined4 uStack_104;
  ListSchema elementType;
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  Schema local_b8;
  Builder local_b0;
  StructBuilder local_98;
  ListBuilder local_70;
  ListBuilder local_48;
  
  _kjCondition.left = &index_local;
  uVar12 = (this->builder).elementCount;
  _kjCondition.right = uVar12;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = index < uVar12;
  index_local = index;
  if (uVar12 <= index) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x44a,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
               &_kjCondition,(char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  WVar11 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar11 = (this->schema).elementType.baseType;
  }
  switch(WVar11) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->builder).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar14 = (ulong)(char)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_001c925d;
  case INT16:
    uVar14 = (ulong)*(short *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_001c925d;
  case INT32:
    uVar14 = (ulong)*(int *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
                            );
    goto LAB_001c925d;
  case INT64:
    uVar14 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_001c925d:
    __return_storage_ptr__->type = INT;
LAB_001c92fb:
    (__return_storage_ptr__->field_1).intValue = uVar14;
    break;
  case UINT8:
    uVar14 = (ulong)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_001c92f5;
  case UINT16:
    uVar14 = (ulong)*(ushort *)
                     ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_001c92f5;
  case UINT32:
    uVar14 = (ulong)*(uint *)((this->builder).ptr +
                             ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_001c92f5;
  case UINT64:
    uVar14 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_001c92f5:
    __return_storage_ptr__->type = UINT;
    goto LAB_001c92fb;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_001c92d3;
  case FLOAT64:
    dVar1 = *(double *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_001c92d3:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::getBlob<capnp::Text>
              (&local_b0,(PointerBuilder *)&_kjCondition,(void *)0x0,0);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_b0.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_b0._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_b0.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    AVar19 = (ArrayPtr<unsigned_char>)
             capnp::_::PointerBuilder::getBlob<capnp::Data>
                       ((PointerBuilder *)&_kjCondition,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar19;
    break;
  case LIST:
    TVar18 = (Type)Type::asList((Type *)this);
    elementType.elementType.listDepth = TVar18.listDepth;
    elementType.elementType = TVar18;
    if ((elementType.elementType.listDepth == '\0') && (TVar18.baseType == STRUCT)) {
      f.exception = (Exception *)(this->builder).segment;
      local_b8.raw = (RawBrandedSchema *)Type::asStruct(&elementType.elementType);
      Schema::getProto((Reader *)&_kjCondition,&local_b8);
      uVar17 = 0;
      uVar12 = 0;
      if (0x7f < (uint)_kjCondition._32_4_) {
        uVar12 = (uint)*(ushort *)(_kjCondition.op.content.ptr + 0xe);
      }
      if (0xcf < (uint)_kjCondition._32_4_) {
        uVar17 = (uint)*(ushort *)(_kjCondition.op.content.ptr + 0x18) << 0x10;
      }
      __return_storage_ptr___00 = &local_48;
      capnp::_::PointerBuilder::getStructList
                (__return_storage_ptr___00,(PointerBuilder *)&f,(StructSize)(uVar17 | uVar12),
                 (word *)0x0);
    }
    else {
      _kjCondition.op.content.ptr =
           (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
      _kjCondition.left = (uint *)(this->builder).segment;
      _kjCondition._8_8_ = (this->builder).capTable;
      WVar11 = LIST;
      if (elementType.elementType.listDepth == '\0') {
        WVar11 = TVar18.baseType;
      }
      EVar10 = anon_unknown_71::elementSizeFor(WVar11);
      __return_storage_ptr___00 = &local_70;
      capnp::_::PointerBuilder::getList
                (__return_storage_ptr___00,(PointerBuilder *)&_kjCondition,EVar10,(word *)0x0);
    }
    SVar6 = __return_storage_ptr___00->structPointerCount;
    EVar10 = __return_storage_ptr___00->elementSize;
    uVar7 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) = SVar6;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = EVar10;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = uVar7;
    pSVar4 = __return_storage_ptr___00->segment;
    pCVar5 = __return_storage_ptr___00->capTable;
    LVar8 = __return_storage_ptr___00->elementCount;
    BVar9 = __return_storage_ptr___00->step;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = LVar8;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = BVar9;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pSVar4;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar5;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar18;
    break;
  case ENUM:
    EVar15 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)
             ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar15.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar13 = Type::asStruct((Type *)this);
    capnp::_::ListBuilder::getStructElement(&local_98,&this->builder,index_local);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_98._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_98.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_98.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_98.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_98.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar13.super_Schema.raw;
    break;
  case INTERFACE:
    IVar16 = Type::asInterface((Type *)this);
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::getCapability((PointerBuilder *)&f);
    __return_storage_ptr__->type = CAPABILITY;
    *(undefined4 *)&__return_storage_ptr__->field_1 = f.exception._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = f.exception._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = uStack_108;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = uStack_104;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar16.super_Schema.raw;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x47d,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}